

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

shared_ptr<mocker::ast::IdentifierExpr> __thiscall
mocker::Parser::identifierExpr(Parser *this,TokIter *iter,TokIter end)

{
  mapped_type *pmVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<mocker::ast::Identifier> sVar3;
  shared_ptr<mocker::ast::IdentifierExpr> sVar4;
  Position beg;
  shared_ptr<mocker::ast::Identifier> res;
  Parser local_38;
  
  sVar3 = identifier(&local_38,iter,end);
  _Var2 = sVar3.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if (local_38.tokBeg._M_current != (Token *)0x0) {
    local_38.pos = (unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                    *)local_38.tokBeg._M_current;
    pmVar1 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)iter[2]._M_current,(key_type *)&local_38.pos);
    beg.col = (pmVar1->first).line;
    beg.line = (size_t)iter;
    sVar4 = makeNode<mocker::ast::IdentifierExpr,std::shared_ptr<mocker::ast::Identifier>&>
                      (this,beg,*(Position *)&(pmVar1->first).col,
                       (shared_ptr<mocker::ast::Identifier> *)(pmVar1->second).col);
    _Var2 = sVar4.super___shared_ptr<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  if (local_38.tokEnd._M_current != (Token *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.tokEnd._M_current);
    _Var2._M_pi = extraout_RDX;
  }
  if (local_38.tokBeg._M_current == (Token *)0x0) {
    (this->tokBeg)._M_current = (Token *)0x0;
    (this->tokEnd)._M_current = (Token *)0x0;
  }
  sVar4.super___shared_ptr<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  sVar4.super___shared_ptr<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::IdentifierExpr>)
         sVar4.super___shared_ptr<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::IdentifierExpr> Parser::identifierExpr(TokIter &iter,
                                                            TokIter end) {
  if (auto res = identifier(iter, end))
    return makeNode<ast::IdentifierExpr>(pos[res->getID()], res);
  return nullptr;
}